

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O2

tommy_trie_inplace_node *
tommy_trie_inplace_bucket(tommy_trie_inplace *trie_inplace,tommy_key_t key)

{
  tommy_trie_inplace_node *ptVar1;
  tommy_trie_inplace_node_struct **pptVar2;
  byte bVar3;
  long in_FS_OFFSET;
  
  pptVar2 = trie_inplace->bucket + (key >> 0x1a);
  bVar3 = 0x1a;
  while( true ) {
    ptVar1 = *pptVar2;
    if ((ptVar1 == (tommy_trie_inplace_node *)0x0) || (ptVar1->key == key)) break;
    pptVar2 = ptVar1->map + (key >> (bVar3 & 0x1f) & 3);
    bVar3 = bVar3 - 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ptVar1;
  }
  __stack_chk_fail();
}

Assistant:

tommy_trie_inplace_node* tommy_trie_inplace_bucket(tommy_trie_inplace* trie_inplace, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	tommy_uint_t shift;

	node = trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];
	shift = TOMMY_TRIE_INPLACE_BUCKET_SHIFT;

	while (node && node->key != key) {
		node = node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	return node;
}